

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O2

LIBSSH2_SESSION * start_session_fixture(int *skipped,int *err)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *__s2;
  LIBSSH2_SESSION *pLVar4;
  char *pcVar5;
  char **sk;
  char **ppcVar6;
  size_t sStack_30;
  
  pcVar3 = getenv("FIXTURE_TEST_CRYPT");
  __s2 = getenv("FIXTURE_TEST_MAC");
  *skipped = 0;
  *err = 0;
  if (pcVar3 != (char *)0x0) {
    ppcVar6 = skip_crypt;
    do {
      if (*ppcVar6 == (char *)0x0) goto LAB_001024fa;
      iVar1 = strcmp(*ppcVar6,pcVar3);
      ppcVar6 = ppcVar6 + 1;
    } while (iVar1 != 0);
    pcVar5 = "unsupported crypt algorithm (%s) skipped.\n";
    __s2 = pcVar3;
LAB_00102535:
    fprintf(_stderr,pcVar5,__s2);
    *skipped = 1;
    return (LIBSSH2_SESSION *)0x0;
  }
LAB_001024fa:
  if (__s2 != (char *)0x0) {
    ppcVar6 = skip_mac;
    do {
      if (*ppcVar6 == (char *)0x0) goto LAB_00102549;
      iVar1 = strcmp(*ppcVar6,__s2);
      ppcVar6 = ppcVar6 + 1;
    } while (iVar1 != 0);
    pcVar5 = "unsupported MAC algorithm (%s) skipped.\n";
    goto LAB_00102535;
  }
LAB_00102549:
  iVar1 = start_openssh_fixture();
  if (iVar1 != 0) {
    return (LIBSSH2_SESSION *)0x0;
  }
  uVar2 = libssh2_init(0);
  if (uVar2 != 0) {
    fprintf(_stderr,"libssh2_init failed (%d)\n",(ulong)uVar2);
    return (LIBSSH2_SESSION *)0x0;
  }
  pLVar4 = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0,0);
  connected_session = pLVar4;
  if (pLVar4 == (LIBSSH2_SESSION *)0x0) {
    fwrite("libssh2_session_init_ex failed\n",0x1f,1,_stderr);
    return (LIBSSH2_SESSION *)0x0;
  }
  pcVar5 = getenv("FIXTURE_TRACE_ALL_CONNECT");
  if (pcVar5 == (char *)0x0) {
    pcVar5 = getenv("FIXTURE_TRACE_ALL");
    if (pcVar5 != (char *)0x0) {
      libssh2_trace(pLVar4,0xffffffffffffffff);
      pcVar5 = "Trace all enabled.\n";
      sStack_30 = 0x13;
      goto LAB_001025e5;
    }
  }
  else {
    libssh2_trace(pLVar4,0xffffffffffffffff);
    pcVar5 = "Trace all enabled for connect_to_server.\n";
    sStack_30 = 0x29;
LAB_001025e5:
    fwrite(pcVar5,sStack_30,1,_stdout);
  }
  if ((pcVar3 == (char *)0x0) ||
     ((iVar1 = libssh2_session_method_pref(connected_session,2,pcVar3), iVar1 == 0 &&
      (iVar1 = libssh2_session_method_pref(connected_session,3,pcVar3), iVar1 == 0)))) {
    if ((__s2 == (char *)0x0) ||
       ((iVar1 = libssh2_session_method_pref(connected_session,4,__s2), iVar1 == 0 &&
        (iVar1 = libssh2_session_method_pref(connected_session,5,__s2), iVar1 == 0)))) {
      libssh2_session_set_blocking(connected_session,1);
      connected_socket = open_socket_to_openssh_server();
      if (connected_socket == -1) {
        iVar1 = -1;
LAB_001026d8:
        *err = iVar1;
        return (LIBSSH2_SESSION *)0x0;
      }
      iVar1 = libssh2_session_handshake(connected_session,connected_socket);
      if (iVar1 != 0) {
        print_last_session_error("libssh2_session_handshake");
        iVar1 = libssh2_session_last_errno(connected_session);
        if (iVar1 != 0) goto LAB_001026d8;
      }
      pcVar3 = getenv("FIXTURE_TRACE_ALL_CONNECT");
      if (pcVar3 != (char *)0x0) {
        libssh2_trace(connected_session,0);
        return connected_session;
      }
      return connected_session;
    }
    pcVar5 = "libssh2_session_method_pref MAC failed (probably disabled in the build): \'%s\'\n";
    pcVar3 = __s2;
  }
  else {
    pcVar5 = "libssh2_session_method_pref CRYPT failed (probably disabled in the build): \'%s\'\n";
  }
  fprintf(_stderr,pcVar5,pcVar3);
  return (LIBSSH2_SESSION *)0x0;
}

Assistant:

LIBSSH2_SESSION *start_session_fixture(int *skipped, int *err)
{
    int rc;

    const char *crypt = getenv("FIXTURE_TEST_CRYPT");
    const char *mac = getenv("FIXTURE_TEST_MAC");

    *skipped = 0;
    *err = LIBSSH2_ERROR_NONE;

    if(crypt) {
        char const * const *sk;
        for(sk = skip_crypt; *sk; ++sk) {
            if(strcmp(*sk, crypt) == 0) {
                fprintf(stderr, "unsupported crypt algorithm (%s) skipped.\n",
                                crypt);
                *skipped = 1;
                return NULL;
            }
        }
    }

    if(mac) {
        char const * const *sk;
        for(sk = skip_mac; *sk; ++sk) {
            if(strcmp(*sk, mac) == 0) {
                fprintf(stderr, "unsupported MAC algorithm (%s) skipped.\n",
                                mac);
                *skipped = 1;
                return NULL;
            }
        }
    }

    rc = start_openssh_fixture();
    if(rc) {
        return NULL;
    }
    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2_init failed (%d)\n", rc);
        return NULL;
    }

    connected_session = libssh2_session_init_ex(NULL, NULL, NULL, NULL);
    if(!connected_session) {
        fprintf(stderr, "libssh2_session_init_ex failed\n");
        return NULL;
    }

    if(getenv("FIXTURE_TRACE_ALL_CONNECT")) {
        libssh2_trace(connected_session, ~0);
        fprintf(stdout, "Trace all enabled for connect_to_server.\n");
    }
    else if(getenv("FIXTURE_TRACE_ALL")) {
        libssh2_trace(connected_session, ~0);
        fprintf(stdout, "Trace all enabled.\n");
    }

    /* Override crypt algorithm for the test */
    if(crypt) {
        if(libssh2_session_method_pref(connected_session,
                                       LIBSSH2_METHOD_CRYPT_CS, crypt) ||
           libssh2_session_method_pref(connected_session,
                                       LIBSSH2_METHOD_CRYPT_SC, crypt)) {
            fprintf(stderr, "libssh2_session_method_pref CRYPT failed "
                            "(probably disabled in the build): '%s'\n", crypt);
            return NULL;
        }
    }

    /* Override mac algorithm for the test */
    if(mac) {
        if(libssh2_session_method_pref(connected_session,
                                       LIBSSH2_METHOD_MAC_CS, mac) ||
           libssh2_session_method_pref(connected_session,
                                       LIBSSH2_METHOD_MAC_SC, mac)) {
            fprintf(stderr, "libssh2_session_method_pref MAC failed "
                            "(probably disabled in the build): '%s'\n", mac);
            return NULL;
        }
    }

    libssh2_session_set_blocking(connected_session, 1);

    rc = connect_to_server();
    if(rc != LIBSSH2_ERROR_NONE) {
        *err = rc;
        return NULL;
    }

    if(getenv("FIXTURE_TRACE_ALL_CONNECT")) {
        libssh2_trace(connected_session, 0);
    }

    return connected_session;
}